

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O2

void __thiscall skiplist_tests::getlocator_test::test_method(getlocator_test *this)

{
  uchar *puVar1;
  pointer a;
  undefined1 auVar2 [8];
  readonly_property<bool> rVar3;
  int iVar4;
  uint uVar5;
  uint i;
  ulong uVar6;
  ulong uVar7;
  pointer pCVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  CChain *pCVar10;
  iterator pvVar11;
  long lVar12;
  CBlockIndex *index;
  int iVar13;
  base_blob<256U> *a_00;
  long in_FS_OFFSET;
  bool bVar14;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar15;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  uint dist;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vBlocksSide;
  vector<uint256,_std::allocator<uint256>_> vHashSide;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<CBlockIndex,_std::allocator<CBlockIndex>_> vBlocksMain;
  vector<uint256,_std::allocator<uint256>_> vHashMain;
  undefined1 local_f8 [32];
  CBlockLocator locator;
  CChain chain;
  undefined1 local_98 [8];
  element_type *local_90;
  shared_count asStack_88 [2];
  undefined1 local_78 [8];
  element_type *local_70;
  shared_count sStack_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  base_uint<256U> *pbStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&vHashMain,100000,(allocator_type *)local_58);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            (&vBlocksMain,100000,(allocator_type *)local_58);
  for (uVar5 = 0; uVar6 = (ulong)uVar5,
      uVar6 < (ulong)(((long)vBlocksMain.
                             super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)vBlocksMain.
                            super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x98); uVar5 = uVar5 + 1) {
    base_uint<256U>::base_uint((base_uint<256U> *)local_78,uVar6);
    ArithToUint256((uint256 *)local_58,(arith_uint256 *)local_78);
    puVar1 = vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6].super_base_blob<256U>.m_data._M_elems + 0x10;
    *(undefined8 *)puVar1 = local_58._16_8_;
    *(base_uint<256U> **)(puVar1 + 8) = pbStack_40;
    *(undefined8 *)
     vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
     ._M_start[uVar6].super_base_blob<256U>.m_data._M_elems = local_58._0_8_;
    *(ulong *)(vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6].super_base_blob<256U>.m_data._M_elems + 8) =
         CONCAT71(local_58._9_7_,local_58[8]);
    pCVar8 = (pointer)0x0;
    if (uVar5 != 0) {
      pCVar8 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar5 - 1);
    }
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].nHeight = uVar5;
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].pprev = pCVar8;
    vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].phashBlock =
         vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start + uVar6;
    CBlockIndex::BuildSkip
              (vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6);
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x39;
    file.m_begin = (iterator)&local_138;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)pCVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011480b0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    pbStack_40 = (base_uint<256U> *)0xc7f1cc;
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_150 = "";
    CBlockIndex::GetBlockHash
              ((uint256 *)local_98,
               vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6);
    UintToArith256((arith_uint256 *)local_78,(uint256 *)local_98);
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(chain.vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,local_78._0_4_);
    pvVar9 = (iterator)0x2;
    pCVar10 = &chain;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              ((lazy_ostream *)local_58,&local_158,0x39,1,2,pCVar10,
               "(int)UintToArith256(vBlocksMain[i].GetBlockHash()).GetLow64()",
               &vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].nHeight,"vBlocksMain[i].nHeight");
    local_168 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_160 = "";
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar15 = 0x50895a;
    file_00.m_end = (iterator)0x3a;
    file_00.m_begin = (iterator)&local_168;
    msg_00.m_end = (iterator)pCVar10;
    msg_00.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
               msg_00);
    if (vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6].pprev == (CBlockIndex *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6].nHeight ==
               (vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].pprev)->nHeight + 1;
    }
    local_78[0] = bVar14;
    local_70 = (element_type *)0x0;
    sStack_68.pi_ = (sp_counted_base *)0x0;
    local_98 = (undefined1  [8])0xc50634;
    local_90 = (element_type *)0xc50692;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011481f0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_180 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    pbStack_40 = (base_uint<256U> *)local_98;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar15,
               (size_t)&local_188,0x3a);
    boost::detail::shared_count::~shared_count(&sStack_68);
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (&vHashSide,50000,(allocator_type *)local_58);
  std::vector<CBlockIndex,_std::allocator<CBlockIndex>_>::vector
            (&vBlocksSide,50000,(allocator_type *)local_58);
  uVar6 = 0xffffffffffffffff;
  while (iVar4 = (int)uVar6, uVar7 = (ulong)(iVar4 + 1),
        uVar7 < (ulong)(((long)vBlocksSide.
                               super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)vBlocksSide.
                              super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x98)) {
    base_uint<256U>::base_uint((base_uint<256U> *)&chain,(ulong)(iVar4 + 0xc351U));
    base_uint<256U>::base_uint((base_uint<256U> *)local_f8,1);
    ::operator<<((base_uint<256U> *)&locator,(base_uint<256U> *)local_f8,0x80);
    ::operator+((base_uint<256U> *)local_98,(base_uint<256U> *)&chain,(base_uint<256U> *)&locator);
    base_uint<256U>::base_uint((base_uint<256U> *)local_78,(base_uint<256U> *)local_98);
    ArithToUint256((uint256 *)local_58,(arith_uint256 *)local_78);
    puVar1 = vHashSide.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7].super_base_blob<256U>.m_data._M_elems + 0x10;
    *(undefined8 *)puVar1 = local_58._16_8_;
    *(base_uint<256U> **)(puVar1 + 8) = pbStack_40;
    *(undefined8 *)
     vHashSide.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
     ._M_start[uVar7].super_base_blob<256U>.m_data._M_elems = local_58._0_8_;
    *(ulong *)(vHashSide.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7].super_base_blob<256U>.m_data._M_elems + 8) =
         CONCAT71(local_58._9_7_,local_58[8]);
    vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7].nHeight = iVar4 + 0xc351U;
    pvVar9 = (iterator)0x73f6e8;
    pCVar8 = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
             super__Vector_impl_data._M_start + 49999;
    if (iVar4 != -1) {
      pCVar8 = vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar6 & 0xffffffff);
    }
    vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7].pprev = pCVar8;
    vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7].phashBlock =
         vHashSide.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start + uVar7;
    CBlockIndex::BuildSkip
              (vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + uVar7);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x46;
    file_01.m_begin = (iterator)&local_1c8;
    msg_01.m_end = in_R9;
    msg_01.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8,
               msg_01);
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011480b0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    pbStack_40 = (base_uint<256U> *)0xc7f1cc;
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_1e0 = "";
    CBlockIndex::GetBlockHash
              ((uint256 *)local_98,
               vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start + uVar7);
    UintToArith256((arith_uint256 *)local_78,(uint256 *)local_98);
    chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(chain.vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,local_78._0_4_);
    pvVar9 = (iterator)0x2;
    pCVar10 = &chain;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_58,&local_1e8,0x46,1,2,pCVar10,
               "(int)UintToArith256(vBlocksSide[i].GetBlockHash()).GetLow64()",
               &vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7].nHeight,"vBlocksSide[i].nHeight");
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar15 = 0x508d19;
    file_02.m_end = (iterator)0x47;
    file_02.m_begin = (iterator)&local_1f8;
    msg_02.m_end = (iterator)pCVar10;
    msg_02.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_208,
               msg_02);
    if (vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7].pprev == (CBlockIndex *)0x0) {
      bVar14 = true;
    }
    else {
      bVar14 = vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7].nHeight ==
               (vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7].pprev)->nHeight + 1;
    }
    local_78[0] = bVar14;
    local_70 = (element_type *)0x0;
    sStack_68.pi_ = (sp_counted_base *)0x0;
    local_98 = (undefined1  [8])0xc506e8;
    local_90 = (element_type *)0xc50746;
    local_58[8] = false;
    local_58._0_8_ = &PTR__lazy_ostream_011481f0;
    local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_210 = "";
    in_R9 = (iterator)0x0;
    in_R8 = &DAT_00000001;
    pbStack_40 = (base_uint<256U> *)local_98;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_78,(lazy_ostream *)local_58,1,0,WARN,_cVar15,
               (size_t)&local_218,0x47);
    boost::detail::shared_count::~shared_count(&sStack_68);
    uVar6 = uVar7;
  }
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CChain::SetTip(&chain,vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>.
                        _M_impl.super__Vector_impl_data._M_finish + -1);
  iVar4 = 0;
  while( true ) {
    if (iVar4 == 100) break;
    uVar5 = RandomMixin<FastRandomContext>::randrange<int>
                      (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                        super_RandomMixin<FastRandomContext>,150000);
    if ((int)uVar5 < 100000) {
      index = vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
              super__Vector_impl_data._M_start + (int)uVar5;
    }
    else {
      index = vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
              super__Vector_impl_data._M_start + ((ulong)uVar5 - 100000);
    }
    GetLocator(&locator,index);
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x55;
    file_03.m_begin = (iterator)&local_228;
    msg_03.m_end = in_R9;
    msg_03.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_238,
               msg_03);
    a = locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start;
    CBlockIndex::GetBlockHash((uint256 *)local_58,index);
    _cVar15 = 0x508f0e;
    rVar3.super_class_property<bool>.value =
         (class_property<bool>)::operator==(&a->super_base_blob<256U>,(base_blob<256U> *)local_58);
    local_90 = (element_type *)0x0;
    asStack_88[0].pi_ = (sp_counted_base *)0x0;
    local_f8._0_8_ = "locator.vHave.front() == tip->GetBlockHash()";
    local_f8._8_8_ = "";
    local_70 = (element_type *)((ulong)local_70 & 0xffffffffffffff00);
    local_78 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_240 = "";
    pvVar9 = &DAT_00000001;
    pvVar11 = (iterator)0x0;
    local_60 = local_f8;
    local_98[0] = rVar3.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar15,
               (size_t)&local_248,0x55);
    boost::detail::shared_count::~shared_count(asStack_88);
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x56;
    file_04.m_begin = (iterator)&local_258;
    msg_04.m_end = pvVar11;
    msg_04.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_268,
               msg_04);
    a_00 = &locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].super_base_blob<256U>;
    CBlockIndex::GetBlockHash
              ((uint256 *)local_58,
               vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
               super__Vector_impl_data._M_start);
    _cVar15 = 0x509032;
    local_98[0] = (class_property<bool>)::operator==(a_00,(base_blob<256U> *)local_58);
    local_90 = (element_type *)0x0;
    asStack_88[0].pi_ = (sp_counted_base *)0x0;
    local_f8._0_8_ = "locator.vHave.back() == vBlocksMain[0].GetBlockHash()";
    local_f8._8_8_ = "";
    local_70 = (element_type *)((ulong)local_70 & 0xffffffffffffff00);
    local_78 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
    sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_270 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    local_60 = local_f8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_98,(lazy_ostream *)local_78,1,0,WARN,_cVar15,
               (size_t)&local_278,0x56);
    boost::detail::shared_count::~shared_count(asStack_88);
    iVar13 = -1;
    lVar12 = 0x20;
    for (uVar6 = 1;
        (lVar12 != 0x180 &&
        (uVar6 < ((long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5) - 1U)); uVar6 = uVar6 + 1) {
      local_288 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_280 = "";
      local_298 = &boost::unit_test::basic_cstring<char_const>::null;
      local_290 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x5a;
      file_05.m_begin = (iterator)&local_288;
      msg_05.m_end = in_R9;
      msg_05.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
                 msg_05);
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_011480b0;
      local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
      pbStack_40 = (base_uint<256U> *)0xc7f1cc;
      local_2a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_2a0 = "";
      UintToArith256((arith_uint256 *)local_78,
                     (uint256 *)
                     (((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar12));
      local_98 = local_78;
      local_f8._0_4_ = index->nHeight + iVar13;
      in_R8 = (iterator)0x2;
      in_R9 = local_98;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_58,&local_2a8,0x5a,1,2,in_R9,"UintToArith256(locator.vHave[i]).GetLow64()",
                 local_f8,"tip->nHeight - i");
      lVar12 = lVar12 + 0x20;
      iVar13 = iVar13 + -1;
    }
    dist = 2;
    uVar6 = 0xb;
    while (uVar7 = (ulong)((int)uVar6 + 1),
          uVar7 < ((long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                         .super__Vector_impl_data._M_start >> 5) - 1U) {
      local_2c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_2b8 = "";
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x60;
      file_06.m_begin = (iterator)&local_2c0;
      msg_06.m_end = in_R9;
      msg_06.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2d0,
                 msg_06);
      local_58[8] = false;
      local_58._0_8_ = &PTR__lazy_ostream_011480b0;
      local_58._16_8_ = boost::unit_test::lazy_ostream::inst;
      pbStack_40 = (base_uint<256U> *)0xc7f1cc;
      local_2e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_2d8 = "";
      UintToArith256((arith_uint256 *)local_78,
                     locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar6);
      auVar2 = local_78;
      UintToArith256((arith_uint256 *)local_98,
                     locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar7);
      local_f8._0_8_ = (long)auVar2 - (long)local_98;
      in_R8 = (iterator)0x2;
      in_R9 = local_f8;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (local_58,&local_2e0,0x60,1,2,local_f8,
                 "UintToArith256(locator.vHave[i - 1]).GetLow64() - UintToArith256(locator.vHave[i]).GetLow64()"
                 ,&dist,"dist");
      dist = dist << 1;
      uVar6 = uVar7;
    }
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator);
    iVar4 = iVar4 + 1;
  }
  std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
            ((_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&chain);
  std::_Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>::~_Vector_base
            (&vBlocksSide.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vHashSide.super__Vector_base<uint256,_std::allocator<uint256>_>);
  std::_Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>::~_Vector_base
            (&vBlocksMain.super__Vector_base<CBlockIndex,_std::allocator<CBlockIndex>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&vHashMain.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(getlocator_test)
{
    // Build a main chain 100000 blocks long.
    std::vector<uint256> vHashMain(100000);
    std::vector<CBlockIndex> vBlocksMain(100000);
    for (unsigned int i=0; i<vBlocksMain.size(); i++) {
        vHashMain[i] = ArithToUint256(i); // Set the hash equal to the height, so we can quickly check the distances.
        vBlocksMain[i].nHeight = i;
        vBlocksMain[i].pprev = i ? &vBlocksMain[i - 1] : nullptr;
        vBlocksMain[i].phashBlock = &vHashMain[i];
        vBlocksMain[i].BuildSkip();
        BOOST_CHECK_EQUAL((int)UintToArith256(vBlocksMain[i].GetBlockHash()).GetLow64(), vBlocksMain[i].nHeight);
        BOOST_CHECK(vBlocksMain[i].pprev == nullptr || vBlocksMain[i].nHeight == vBlocksMain[i].pprev->nHeight + 1);
    }

    // Build a branch that splits off at block 49999, 50000 blocks long.
    std::vector<uint256> vHashSide(50000);
    std::vector<CBlockIndex> vBlocksSide(50000);
    for (unsigned int i=0; i<vBlocksSide.size(); i++) {
        vHashSide[i] = ArithToUint256(i + 50000 + (arith_uint256(1) << 128)); // Add 1<<128 to the hashes, so GetLow64() still returns the height.
        vBlocksSide[i].nHeight = i + 50000;
        vBlocksSide[i].pprev = i ? &vBlocksSide[i - 1] : (vBlocksMain.data()+49999);
        vBlocksSide[i].phashBlock = &vHashSide[i];
        vBlocksSide[i].BuildSkip();
        BOOST_CHECK_EQUAL((int)UintToArith256(vBlocksSide[i].GetBlockHash()).GetLow64(), vBlocksSide[i].nHeight);
        BOOST_CHECK(vBlocksSide[i].pprev == nullptr || vBlocksSide[i].nHeight == vBlocksSide[i].pprev->nHeight + 1);
    }

    // Build a CChain for the main branch.
    CChain chain;
    chain.SetTip(vBlocksMain.back());

    // Test 100 random starting points for locators.
    for (int n=0; n<100; n++) {
        int r = m_rng.randrange(150000);
        CBlockIndex* tip = (r < 100000) ? &vBlocksMain[r] : &vBlocksSide[r - 100000];
        CBlockLocator locator = GetLocator(tip);

        // The first result must be the block itself, the last one must be genesis.
        BOOST_CHECK(locator.vHave.front() == tip->GetBlockHash());
        BOOST_CHECK(locator.vHave.back() == vBlocksMain[0].GetBlockHash());

        // Entries 1 through 11 (inclusive) go back one step each.
        for (unsigned int i = 1; i < 12 && i < locator.vHave.size() - 1; i++) {
            BOOST_CHECK_EQUAL(UintToArith256(locator.vHave[i]).GetLow64(), tip->nHeight - i);
        }

        // The further ones (excluding the last one) go back with exponential steps.
        unsigned int dist = 2;
        for (unsigned int i = 12; i < locator.vHave.size() - 1; i++) {
            BOOST_CHECK_EQUAL(UintToArith256(locator.vHave[i - 1]).GetLow64() - UintToArith256(locator.vHave[i]).GetLow64(), dist);
            dist *= 2;
        }
    }
}